

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cui.hpp
# Opt level: O1

void __thiscall ghc::cui::application::handle_resize(application *this)

{
  pointer pwVar1;
  element_type *peVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pwVar6;
  bool bVar7;
  
  window_base::fill(&this->super_window_base,' ');
  lVar3 = _stdscr;
  iVar5 = -1;
  iVar4 = -1;
  if (_stdscr != 0) {
    iVar4 = *(short *)(_stdscr + 4) + 1;
  }
  (this->super_window_base)._height = iVar4;
  if (lVar3 != 0) {
    iVar5 = *(short *)(lVar3 + 6) + 1;
  }
  (this->super_window_base)._width = iVar5;
  (*(this->super_window_base)._vptr_window_base[5])(this);
  pwVar6 = (this->_windows).
           super__Vector_base<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pwVar1 = (this->_windows).
           super__Vector_base<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pwVar6 == pwVar1) {
      refresh();
      return;
    }
    this_00 = (pwVar6->super___weak_ptr<ghc::cui::window,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = this_00->_M_use_count;
      do {
        if (iVar4 == 0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar5 = this_00->_M_use_count;
        bVar7 = iVar4 == iVar5;
        if (bVar7) {
          this_00->_M_use_count = iVar4 + 1;
          iVar5 = iVar4;
        }
        iVar4 = iVar5;
        UNLOCK();
      } while (!bVar7);
    }
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = this_00->_M_use_count == 0;
    }
    peVar2 = (pwVar6->super___weak_ptr<ghc::cui::window,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2 != (element_type *)0x0 && !bVar7) {
      (*(peVar2->super_window_base)._vptr_window_base[4])
                (peVar2,(ulong)(uint)(this->super_window_base)._width,
                 (ulong)(uint)(this->super_window_base)._height);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pwVar6 = pwVar6 + 1;
  } while( true );
}

Assistant:

GHC_INLINE void application::handle_resize()
{
    clear();
    getmaxyx(stdscr, _height, _width);
    on_resize(_width, _height);
    for (const auto& window : _windows) {
        auto w = window.lock();
        if (w) {
            w->on_resize(_width, _height);
        }
    }
    ::refresh();
}